

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::lastIndexOf
                    (QStringView viewHaystack,QString *stringHaystack,QRegularExpression *re,
                    qsizetype from,QRegularExpressionMatch *rmatch)

{
  QStringView subjectView;
  bool bVar1;
  QRegularExpressionMatchIterator *pQVar2;
  qsizetype qVar3;
  undefined8 in_RCX;
  long in_RDX;
  long in_R8;
  long in_R9;
  long in_FS_OFFSET;
  qsizetype start;
  qsizetype lastIndex;
  qsizetype endpos;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator iterator;
  undefined4 in_stack_fffffffffffffef8;
  MatchOption in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QString *in_stack_ffffffffffffff08;
  QRegularExpressionMatchIterator *pQVar4;
  undefined8 in_stack_ffffffffffffff40;
  MatchType matchType;
  undefined4 in_stack_ffffffffffffff48;
  MatchType in_stack_ffffffffffffff4c;
  int iVar5;
  QString *in_stack_ffffffffffffff50;
  QRegularExpression *in_stack_ffffffffffffff58;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions;
  storage_type_conflict *in_stack_ffffffffffffff98;
  qsizetype qVar6;
  undefined4 local_54;
  QStringView local_18;
  long local_8;
  
  matchOptions.i = (Int)((ulong)in_RCX >> 0x20);
  matchType = (MatchType)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QRegularExpression::isValid
                    ((QRegularExpression *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (bVar1) {
    if (in_R8 < 0) {
      qVar6 = QStringView::size(&local_18);
      pQVar2 = (QRegularExpressionMatchIterator *)(qVar6 + in_R8 + 1);
    }
    else {
      pQVar2 = (QRegularExpressionMatchIterator *)(in_R8 + 1);
    }
    pQVar4 = pQVar2;
    if (in_RDX == 0) {
      QFlags<QRegularExpression::MatchOption>::QFlags
                ((QFlags<QRegularExpression::MatchOption> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
      subjectView.m_data = in_stack_ffffffffffffff98;
      subjectView.m_size = in_RDX;
      QRegularExpression::globalMatchView
                (in_stack_ffffffffffffff58,subjectView,(qsizetype)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,(MatchOptions)matchOptions.i);
    }
    else {
      QFlags<QRegularExpression::MatchOption>::QFlags
                ((QFlags<QRegularExpression::MatchOption> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
      QRegularExpression::globalMatch
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),matchType,
                 (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                 SUB84((ulong)in_R9 >> 0x20,0));
      local_54 = in_stack_fffffffffffffef8;
    }
    qVar6 = -1;
    do {
      bVar1 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)0x50fc31);
      if (!bVar1) break;
      QRegularExpressionMatchIterator::next(pQVar4);
      qVar3 = QRegularExpressionMatch::capturedStart
                        ((QRegularExpressionMatch *)in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff04);
      if (qVar3 < (long)pQVar2) {
        if (in_R9 != 0) {
          QRegularExpressionMatch::operator=
                    ((QRegularExpressionMatch *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     (QRegularExpressionMatch *)CONCAT44(in_stack_fffffffffffffefc,local_54));
        }
        iVar5 = 0;
        qVar6 = qVar3;
      }
      else {
        iVar5 = 3;
      }
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x50fd1b);
    } while (iVar5 == 0);
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)0x50fd4e);
  }
  else {
    QRegularExpression::pattern((QRegularExpression *)in_stack_ffffffffffffff08);
    qtWarnAboutInvalidRegularExpression
              (in_stack_ffffffffffffff08,
               (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QString::~QString((QString *)0x50fac7);
    qVar6 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return qVar6;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView viewHaystack, const QString *stringHaystack, const QRegularExpression &re, qsizetype from, QRegularExpressionMatch *rmatch)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::lastIndexOf");
        return -1;
    }

    qsizetype endpos = (from < 0) ? (viewHaystack.size() + from + 1) : (from + 1);
    QRegularExpressionMatchIterator iterator = stringHaystack
            ? re.globalMatch(*stringHaystack)
            : re.globalMatchView(viewHaystack);
    qsizetype lastIndex = -1;
    while (iterator.hasNext()) {
        QRegularExpressionMatch match = iterator.next();
        qsizetype start = match.capturedStart();
        if (start < endpos) {
            lastIndex = start;
            if (rmatch)
                *rmatch = std::move(match);
        } else {
            break;
        }
    }

    return lastIndex;
}